

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

int rtr_mgr_init_sockets
              (rtr_mgr_group *group,rtr_mgr_config *config,uint refresh_interval,
              uint expire_interval,uint retry_interval,rtr_interval_mode iv_mode)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (group->sockets_len != 0) {
    uVar3 = 0;
    do {
      iVar2 = rtr_init(group->sockets[uVar3],(tr_socket *)0x0,config->pfx_table,config->spki_table,
                       config->aspa_table,refresh_interval,expire_interval,retry_interval,
                       RTR_INTERVAL_MODE_DEFAULT_MIN_MAX,rtr_mgr_cb,config,group);
      if (iVar2 != 0) goto LAB_0010644d;
      uVar3 = uVar3 + 1;
    } while (uVar3 < group->sockets_len);
  }
  iVar2 = 0;
LAB_0010644d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_mgr_init_sockets(struct rtr_mgr_group *group, struct rtr_mgr_config *config,
				const unsigned int refresh_interval, const unsigned int expire_interval,
				const unsigned int retry_interval, enum rtr_interval_mode iv_mode)
{
	for (unsigned int i = 0; i < group->sockets_len; i++) {
		enum rtr_rtvals err_code = rtr_init(group->sockets[i], NULL, config->pfx_table, config->spki_table,
						    config->aspa_table, refresh_interval, expire_interval,
						    retry_interval, iv_mode, rtr_mgr_cb, config, group);
		if (err_code)
			return err_code;
	}
	return RTR_SUCCESS;
}